

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RandomBernoulliDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randombernoullidynamic(NeuralNetworkLayer *this)

{
  RandomBernoulliDynamicLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x4c4) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4c4;
    this_00 = (RandomBernoulliDynamicLayerParams *)operator_new(0x20);
    RandomBernoulliDynamicLayerParams::RandomBernoulliDynamicLayerParams(this_00);
    (this->layer_).randombernoullidynamic_ = this_00;
  }
  return (RandomBernoulliDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliDynamicLayerParams* NeuralNetworkLayer::mutable_randombernoullidynamic() {
  if (!has_randombernoullidynamic()) {
    clear_layer();
    set_has_randombernoullidynamic();
    layer_.randombernoullidynamic_ = new ::CoreML::Specification::RandomBernoulliDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomBernoulliDynamic)
  return layer_.randombernoullidynamic_;
}